

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

int mbedtls_entropy_self_test(int verbose)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *__s;
  uchar header [2];
  uchar acc [64];
  uchar buf [64];
  mbedtls_entropy_context ctx;
  uchar local_4aa [2];
  byte local_4a8 [128];
  mbedtls_entropy_context local_428;
  
  local_4a8[0x70] = 0;
  local_4a8[0x71] = 0;
  local_4a8[0x72] = 0;
  local_4a8[0x73] = 0;
  local_4a8[0x74] = 0;
  local_4a8[0x75] = 0;
  local_4a8[0x76] = 0;
  local_4a8[0x77] = 0;
  local_4a8[0x78] = 0;
  local_4a8[0x79] = 0;
  local_4a8[0x7a] = 0;
  local_4a8[0x7b] = 0;
  local_4a8[0x7c] = 0;
  local_4a8[0x7d] = 0;
  local_4a8[0x7e] = 0;
  local_4a8[0x7f] = 0;
  local_4a8[0x60] = 0;
  local_4a8[0x61] = 0;
  local_4a8[0x62] = 0;
  local_4a8[99] = 0;
  local_4a8[100] = 0;
  local_4a8[0x65] = 0;
  local_4a8[0x66] = 0;
  local_4a8[0x67] = 0;
  local_4a8[0x68] = 0;
  local_4a8[0x69] = 0;
  local_4a8[0x6a] = 0;
  local_4a8[0x6b] = 0;
  local_4a8[0x6c] = 0;
  local_4a8[0x6d] = 0;
  local_4a8[0x6e] = 0;
  local_4a8[0x6f] = 0;
  local_4a8[0x50] = 0;
  local_4a8[0x51] = 0;
  local_4a8[0x52] = 0;
  local_4a8[0x53] = 0;
  local_4a8[0x54] = 0;
  local_4a8[0x55] = 0;
  local_4a8[0x56] = 0;
  local_4a8[0x57] = 0;
  local_4a8[0x58] = 0;
  local_4a8[0x59] = 0;
  local_4a8[0x5a] = 0;
  local_4a8[0x5b] = 0;
  local_4a8[0x5c] = 0;
  local_4a8[0x5d] = 0;
  local_4a8[0x5e] = 0;
  local_4a8[0x5f] = 0;
  local_4a8[0x40] = 0;
  local_4a8[0x41] = 0;
  local_4a8[0x42] = 0;
  local_4a8[0x43] = 0;
  local_4a8[0x44] = 0;
  local_4a8[0x45] = 0;
  local_4a8[0x46] = 0;
  local_4a8[0x47] = 0;
  local_4a8[0x48] = 0;
  local_4a8[0x49] = 0;
  local_4a8[0x4a] = 0;
  local_4a8[0x4b] = 0;
  local_4a8[0x4c] = 0;
  local_4a8[0x4d] = 0;
  local_4a8[0x4e] = 0;
  local_4a8[0x4f] = 0;
  local_4a8[0x30] = 0;
  local_4a8[0x31] = 0;
  local_4a8[0x32] = 0;
  local_4a8[0x33] = 0;
  local_4a8[0x34] = 0;
  local_4a8[0x35] = 0;
  local_4a8[0x36] = 0;
  local_4a8[0x37] = 0;
  local_4a8[0x38] = 0;
  local_4a8[0x39] = 0;
  local_4a8[0x3a] = 0;
  local_4a8[0x3b] = 0;
  local_4a8[0x3c] = 0;
  local_4a8[0x3d] = 0;
  local_4a8[0x3e] = 0;
  local_4a8[0x3f] = 0;
  local_4a8[0x20] = 0;
  local_4a8[0x21] = 0;
  local_4a8[0x22] = 0;
  local_4a8[0x23] = 0;
  local_4a8[0x24] = 0;
  local_4a8[0x25] = 0;
  local_4a8[0x26] = 0;
  local_4a8[0x27] = 0;
  local_4a8[0x28] = 0;
  local_4a8[0x29] = 0;
  local_4a8[0x2a] = 0;
  local_4a8[0x2b] = 0;
  local_4a8[0x2c] = 0;
  local_4a8[0x2d] = 0;
  local_4a8[0x2e] = 0;
  local_4a8[0x2f] = 0;
  local_4a8[0x10] = 0;
  local_4a8[0x11] = 0;
  local_4a8[0x12] = 0;
  local_4a8[0x13] = 0;
  local_4a8[0x14] = 0;
  local_4a8[0x15] = 0;
  local_4a8[0x16] = 0;
  local_4a8[0x17] = 0;
  local_4a8[0x18] = 0;
  local_4a8[0x19] = 0;
  local_4a8[0x1a] = 0;
  local_4a8[0x1b] = 0;
  local_4a8[0x1c] = 0;
  local_4a8[0x1d] = 0;
  local_4a8[0x1e] = 0;
  local_4a8[0x1f] = 0;
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[0xf] = 0;
  if (verbose != 0) {
    printf("  ENTROPY test: ");
  }
  mbedtls_entropy_init(&local_428);
  iVar1 = entropy_gather_internal(&local_428);
  iVar2 = local_428.source_count;
  if (iVar1 == 0) {
    lVar3 = (long)local_428.source_count;
    iVar1 = -0x3e;
    if (lVar3 < 0x14) {
      local_428.source[lVar3].f_source = entropy_dummy_source;
      local_428.source[lVar3].p_source = (void *)0x0;
      local_428.source[lVar3].threshold = 0x10;
      local_428.source[lVar3].strong = 0;
      local_428.source_count = local_428.source_count + 1;
      iVar1 = 0;
    }
    if (iVar2 < 0x14) {
      local_4aa[0] = '\x14';
      local_4aa[1] = '@';
      mbedtls_sha512_update(&local_428.accumulator,local_4aa,2);
      mbedtls_sha512_update(&local_428.accumulator,local_4a8 + 0x40,0x40);
      lVar3 = 0;
      iVar1 = 1;
      do {
        iVar2 = mbedtls_entropy_func(&local_428,local_4a8 + 0x40,0x40);
        if (iVar2 != 0) goto LAB_0013075f;
        lVar4 = 0;
        do {
          local_4a8[lVar4] = local_4a8[lVar4] | local_4a8[lVar4 + 0x40];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x40);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      lVar3 = 0;
      do {
        if (local_4a8[lVar3] == 0) goto LAB_0013075f;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      iVar1 = 0;
    }
  }
LAB_0013075f:
  lVar3 = 0;
  do {
    *(undefined1 *)((long)local_428.accumulator.total + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  if (verbose != 0) {
    __s = "failed";
    if (iVar1 == 0) {
      __s = "passed";
    }
    puts(__s);
    putchar(10);
  }
  return (int)(iVar1 != 0);
}

Assistant:

int mbedtls_entropy_self_test( int verbose )
{
    int ret = 0;
    mbedtls_entropy_context ctx;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    unsigned char acc[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    size_t i, j;

    if( verbose != 0 )
        mbedtls_printf( "  ENTROPY test: " );

    mbedtls_entropy_init( &ctx );

    /* First do a gather to make sure we have default sources */
    if( ( ret = mbedtls_entropy_gather( &ctx ) ) != 0 )
        goto cleanup;

    ret = mbedtls_entropy_add_source( &ctx, entropy_dummy_source, NULL, 16,
                                      MBEDTLS_ENTROPY_SOURCE_WEAK );
    if( ret != 0 )
        goto cleanup;

    if( ( ret = mbedtls_entropy_update_manual( &ctx, buf, sizeof buf ) ) != 0 )
        goto cleanup;

    /*
     * To test that mbedtls_entropy_func writes correct number of bytes:
     * - use the whole buffer and rely on ASan to detect overruns
     * - collect entropy 8 times and OR the result in an accumulator:
     *   any byte should then be 0 with probably 2^(-64), so requiring
     *   each of the 32 or 64 bytes to be non-zero has a false failure rate
     *   of at most 2^(-58) which is acceptable.
     */
    for( i = 0; i < 8; i++ )
    {
        if( ( ret = mbedtls_entropy_func( &ctx, buf, sizeof( buf ) ) ) != 0 )
            goto cleanup;

        for( j = 0; j < sizeof( buf ); j++ )
            acc[j] |= buf[j];
    }

    for( j = 0; j < sizeof( buf ); j++ )
    {
        if( acc[j] == 0 )
        {
            ret = 1;
            goto cleanup;
        }
    }

cleanup:
    mbedtls_entropy_free( &ctx );

    if( verbose != 0 )
    {
        if( ret != 0 )
            mbedtls_printf( "failed\n" );
        else
            mbedtls_printf( "passed\n" );

        mbedtls_printf( "\n" );
    }

    return( ret != 0 );
}